

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

int __thiscall lest::rng::operator()(rng *this,int n)

{
  int iVar1;
  int n_local;
  rng *this_local;
  
  iVar1 = rand();
  return iVar1 % n;
}

Assistant:

inline void shuffle( tests & specification, options option )
{
#if lest_CPP11_OR_GREATER
    std::shuffle( specification.begin(), specification.end(), std::mt19937( option.seed ) );
#else
    lest::srand( option.seed );

    rng generator;
    std::random_shuffle( specification.begin(), specification.end(), generator );
#endif
}